

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
CMU462::HDRImageBuffer::toColor
          (HDRImageBuffer *this,ImageBuffer *target,size_t x0,size_t y0,size_t x1,size_t y1)

{
  Color *c;
  ulong in_RCX;
  ImageBuffer *in_RDX;
  long *in_RDI;
  ImageBuffer *in_R8;
  ulong in_R9;
  float fVar1;
  float r_00;
  float g_00;
  float b_00;
  __type_conflict __x;
  double dVar2;
  float b;
  float g;
  float r;
  Spectrum *s;
  size_t x;
  size_t y;
  float exposure;
  float one_over_gamma;
  float level;
  float gamma;
  float in_stack_ffffffffffffff98;
  ImageBuffer *this_00;
  ulong local_48;
  
  __x = std::pow<int,float>(0,3.44747e-39);
  dVar2 = sqrt(__x);
  fVar1 = (float)dVar2;
  for (local_48 = in_RCX; this_00 = in_RDX, local_48 < in_R9; local_48 = local_48 + 1) {
    for (; this_00 < in_R8; this_00 = (ImageBuffer *)((long)&this_00->w + 1)) {
      c = (Color *)std::vector<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>::operator[]
                             ((vector<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_> *)
                              (in_RDI + 2),(size_type)((long)&this_00->w + local_48 * *in_RDI));
      dVar2 = std::pow((double)(ulong)(uint)(c->r * fVar1),5.21456351771692e-315);
      r_00 = SUB84(dVar2,0);
      dVar2 = std::pow((double)(ulong)(uint)(c->g * fVar1),5.21456351771692e-315);
      g_00 = SUB84(dVar2,0);
      dVar2 = std::pow((double)(ulong)(uint)(c->b * fVar1),5.21456351771692e-315);
      b_00 = SUB84(dVar2,0);
      Color::Color((Color *)&stack0xffffffffffffff8c,r_00,g_00,b_00,1.0);
      ImageBuffer::update_pixel
                (this_00,c,CONCAT44(r_00,g_00),CONCAT44(b_00,in_stack_ffffffffffffff98));
    }
  }
  return;
}

Assistant:

void toColor(ImageBuffer& target, size_t x0, size_t y0, size_t x1,
               size_t y1) {
    float gamma = 2.2f;
    float level = 1.0f;
    float one_over_gamma = 1.0f / gamma;
    float exposure = sqrt(pow(2, level));
    for (size_t y = y0; y < y1; ++y) {
      for (size_t x = x0; x < x1; ++x) {
        const Spectrum& s = data[x + y * w];
        float r = pow(s.r * exposure, one_over_gamma);
        float g = pow(s.g * exposure, one_over_gamma);
        float b = pow(s.b * exposure, one_over_gamma);
        target.update_pixel(Color(r, g, b, 1.0), x, y);
      }
    }
  }